

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O3

void NES_APU_np_FrameSequence(void *chip,int s)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  if (s < 4) {
    lVar5 = 0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      if (*(char *)((long)chip + lVar5 + 0x13c) == '\x01') {
        *(undefined1 *)((long)chip + lVar5 + 0x13c) = 0;
        *(undefined4 *)((long)chip + lVar5 * 4 + 0x150) = 0xf;
        *(undefined4 *)((long)chip + lVar5 * 4 + 0x148) = 0;
      }
      else {
        iVar7 = *(int *)((long)chip + lVar5 * 4 + 0x148);
        iVar2 = *(int *)((long)chip + lVar5 * 4 + 0x140);
        iVar6 = iVar7 + 1;
        if (iVar2 <= iVar7) {
          iVar6 = 0;
        }
        *(int *)((long)chip + lVar5 * 4 + 0x148) = iVar6;
        if (iVar2 <= iVar7) {
          iVar6 = *(int *)((long)chip + lVar5 * 4 + 0x150);
          if ((iVar6 == 0 & *(byte *)((long)chip + lVar5 + 0x13a)) == 1) {
            *(undefined4 *)((long)chip + lVar5 * 4 + 0x150) = 0xf;
          }
          else if (0 < iVar6) {
            *(int *)((long)chip + lVar5 * 4 + 0x150) = iVar6 + -1;
          }
        }
      }
      lVar5 = 1;
      bVar3 = false;
    } while (bVar4);
    if ((s & 1U) == 0) {
      lVar5 = 0;
      bVar3 = true;
      do {
        bVar4 = bVar3;
        if ((*(char *)((long)chip + lVar5 + 0x13a) == '\0') &&
           (iVar6 = *(int *)((long)chip + lVar5 * 4 + 0x158), 0 < iVar6)) {
          *(int *)((long)chip + lVar5 * 4 + 0x158) = iVar6 + -1;
        }
        if (*(char *)((long)chip + lVar5 + 0x118) == '\x01') {
          iVar6 = *(int *)((long)chip + lVar5 * 4 + 0x128);
          *(int *)((long)chip + lVar5 * 4 + 0x128) = iVar6 + -1;
          if (iVar6 < 2) {
            iVar6 = *(int *)((long)chip + lVar5 * 4 + 0x108);
            iVar2 = *(int *)((long)chip + lVar5 * 4 + 0x130);
            bVar1 = *(byte *)((long)chip + lVar5 + 0x11a);
            uVar9 = 0;
            if (bVar4) {
              uVar9 = (uint)bVar1;
            }
            iVar8 = uVar9 + (iVar6 >> ((byte)iVar2 & 0x1f));
            iVar7 = -iVar8;
            if ((bVar1 & 1) == 0) {
              iVar7 = iVar8;
            }
            iVar7 = iVar7 + iVar6;
            *(int *)((long)chip + lVar5 * 4 + 0x110) = iVar7;
            if (((7 < iVar6) && (iVar7 < 0x800)) && (0 < iVar2)) {
              if (iVar7 < 1) {
                iVar7 = 0;
              }
              *(int *)((long)chip + lVar5 * 4 + 0x108) = iVar7;
            }
            *(int *)((long)chip + lVar5 * 4 + 0x128) = *(int *)((long)chip + lVar5 * 4 + 0x120) + 1;
          }
          if (*(char *)((long)chip + lVar5 + 0x11c) == '\x01') {
            *(int *)((long)chip + lVar5 * 4 + 0x128) = *(int *)((long)chip + lVar5 * 4 + 0x120) + 1;
            *(undefined1 *)((long)chip + lVar5 + 0x11c) = 0;
          }
        }
        lVar5 = 1;
        bVar3 = false;
      } while (bVar4);
    }
  }
  return;
}

Assistant:

void NES_APU_np_FrameSequence(void* chip, int s)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;

	//DEBUG_OUT("FrameSequence(%d)\n",s);

	if (s > 3) return; // no operation in step 4

	// 240hz clock
	for (i=0; i < 2; ++i)
	{
		bool divider = false;
		if (apu->envelope_write[i])
		{
			apu->envelope_write[i] = false;
			apu->envelope_counter[i] = 15;
			apu->envelope_div[i] = 0;
		}
		else
		{
			++apu->envelope_div[i];
			if (apu->envelope_div[i] > apu->envelope_div_period[i])
			{
				divider = true;
				apu->envelope_div[i] = 0;
			}
		}
		if (divider)
		{
			if (apu->envelope_loop[i] && apu->envelope_counter[i] == 0)
				apu->envelope_counter[i] = 15;
			else if (apu->envelope_counter[i] > 0)
				--apu->envelope_counter[i];
		}
	}

	// 120hz clock
	if ((s&1) == 0)
	  for (i=0; i < 2; ++i)
	  {
		if (!apu->envelope_loop[i] && (apu->length_counter[i] > 0))
			--apu->length_counter[i];

		if (apu->sweep_enable[i])
		{
			//DEBUG_OUT("Clock sweep: %d\n", i);

			--apu->sweep_div[i];
			if (apu->sweep_div[i] <= 0)
			{
				sweep_sqr(apu, i);	// calculate new sweep target

				//DEBUG_OUT("sweep_div[%d] (0/%d)\n",i,apu->sweep_div_period[i]);
				//DEBUG_OUT("freq[%d]=%d > sfreq[%d]=%d\n",i,apu->freq[i],i,apu->sfreq[i]);

				if (apu->freq[i] >= 8 && apu->sfreq[i] < 0x800 && apu->sweep_amount[i] > 0) // update frequency if appropriate
				{
					apu->freq[i] = apu->sfreq[i] < 0 ? 0 : apu->sfreq[i];
				}
				apu->sweep_div[i] = apu->sweep_div_period[i] + 1;

				//DEBUG_OUT("freq[%d]=%d\n",i,apu->freq[i]);
			}

			if (apu->sweep_write[i])
			{
				apu->sweep_div[i] = apu->sweep_div_period[i] + 1;
				apu->sweep_write[i] = false;
			}
		}
	  }

}